

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

uint64 Js::JavascriptExceptionOperators::GetStackTraceLimit
                 (Var thrownObject,ScriptContext *scriptContext)

{
  DisableImplicitFlags DVar1;
  Type TVar2;
  RuntimeFunction *instance;
  code *pcVar3;
  Var aValue;
  bool bVar4;
  HRESULT HVar5;
  BOOL BVar6;
  uint32 uVar7;
  RecyclableObject *pRVar8;
  undefined4 *puVar9;
  double value;
  uint64 uStack_50;
  Var local_38;
  Var var;
  
  if ((((scriptContext->config).threadConfig)->m_errorStackTrace != true) ||
     (bVar4 = IsErrorInstance(thrownObject), !bVar4)) {
    return 0;
  }
  pRVar8 = VarTo<Js::RecyclableObject>(thrownObject);
  HVar5 = JavascriptError::GetRuntimeError(pRVar8,(LPCWSTR *)0x0);
  instance = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).errorConstructor.ptr;
  DVar1 = scriptContext->threadContext->disableImplicitFlags;
  if (HVar5 == -0x7ff5ffe4) {
    scriptContext->threadContext->disableImplicitFlags = DisableImplicitCallAndExceptionFlag;
  }
  local_38 = (Var)0x0;
  BVar6 = JavascriptOperators::GetPropertyNoCache
                    ((RecyclableObject *)instance,0x162,&local_38,scriptContext);
  aValue = local_38;
  if (BVar6 != 0) {
    if (local_38 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_0098b92f;
      *puVar9 = 0;
    }
    bVar4 = TaggedInt::Is(aValue);
    if ((ulong)aValue >> 0x32 == 0 && !bVar4) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_0098b92f;
        *puVar9 = 0;
      }
      TVar2 = ((pRVar8->type).ptr)->typeId;
      if ((int)TVar2 < 0x58) {
        if (TVar2 - TypeIds_FirstNumberType < 4) goto LAB_0098b7e2;
      }
      else {
        BVar6 = RecyclableObject::IsExternal(pRVar8);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_0098b92f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
      }
    }
    else {
LAB_0098b7e2:
      value = JavascriptConversion::ToNumber(local_38,scriptContext);
      BVar6 = JavascriptNumber::IsNan(value);
      if (BVar6 == 0) {
        bVar4 = NumberUtilities::IsFinite(value);
        if (bVar4) {
          uVar7 = JavascriptConversion::ToUInt32(local_38,scriptContext);
          uStack_50 = (uint64)uVar7;
        }
        else {
          uStack_50 = 0xffffffffffffffff;
        }
        goto LAB_0098b90a;
      }
    }
  }
  uStack_50 = 0;
LAB_0098b90a:
  if (HVar5 == -0x7ff5ffe4) {
    scriptContext->threadContext->disableImplicitFlags = DVar1;
  }
  return uStack_50;
}

Assistant:

uint64 JavascriptExceptionOperators::GetStackTraceLimit(Var thrownObject, ScriptContext* scriptContext)
    {
        uint64 limit = 0;

        if (scriptContext->GetConfig()->IsErrorStackTraceEnabled()
            && IsErrorInstance(thrownObject))
        {
            HRESULT hr = JavascriptError::GetRuntimeError(VarTo<RecyclableObject>(thrownObject), NULL);
            JavascriptFunction* error = scriptContext->GetLibrary()->GetErrorConstructor();

            // If we are throwing StackOverflow and Error.stackTraceLimit is a custom getter, we can't make the getter
            // call as we don't have stack space. Just bail out without stack trace in such case. Only proceed to get
            // Error.stackTraceLimit property if we are not throwing StackOverflow, or there is no implicitCall (in getter case).
            DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);
            }

            Var var = nullptr;
            if (JavascriptOperators::GetPropertyNoCache(error, PropertyIds::stackTraceLimit, &var, scriptContext))
            {
                // Only accept the value if it is a "Number". Avoid potential valueOf() call.
                switch (JavascriptOperators::GetTypeId(var))
                {
                case TypeIds_Integer:
                case TypeIds_Number:
                case TypeIds_Int64Number:
                case TypeIds_UInt64Number:
                    double value = JavascriptConversion::ToNumber(var, scriptContext);
                    limit = JavascriptNumber::IsNan(value) ? 0 :
                        (NumberUtilities::IsFinite(value) ? JavascriptConversion::ToUInt32(var, scriptContext) : MaxStackTraceLimit);
                    break;
                }
            }
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);
            }
    }

        return limit;
    }